

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O0

uint __thiscall Costs::closestStateIndex(Costs *this,double *v,double *states,uint p)

{
  uint local_38;
  uint local_34;
  uint mid;
  uint j;
  uint i;
  uint p_local;
  double *states_local;
  double *v_local;
  Costs *this_local;
  
  if (*states < *v) {
    if (*v < states[p - 1]) {
      mid = 0;
      local_38 = 0;
      local_34 = p;
      do {
        while( true ) {
          if (local_34 <= mid) {
            return local_38;
          }
          local_38 = mid + local_34 >> 1;
          if ((states[local_38] == *v) && (!NAN(states[local_38]) && !NAN(*v))) {
            return local_38;
          }
          if (*v < states[local_38]) break;
          if ((local_38 < p - 1) && (*v < states[local_38 + 1])) {
            if (*v * 2.0 < states[local_38] + states[local_38 + 1]) {
              return local_38;
            }
            return local_38 + 1;
          }
          mid = local_38 + 1;
        }
        local_34 = local_38;
      } while ((local_38 == 0) || (*v < states[local_38 - 1] || *v == states[local_38 - 1]));
      this_local._4_4_ = local_38;
      if (*v * 2.0 < states[local_38 - 1] + states[local_38]) {
        this_local._4_4_ = local_38 - 1;
      }
    }
    else {
      this_local._4_4_ = p - 1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int Costs::closestStateIndex(double& v, double* states, unsigned int p)
{
  if(v <= states[0]){return(0);}
  if(v >= states[p - 1]){return(p - 1);}

  // binary search
  unsigned int i = 0;
  unsigned int j = p;
  unsigned int mid = 0;
  while(i < j)
  {
    mid = (i + j)/2;
    if(states[mid] == v){return(mid);}

    if(v < states[mid])
    {
      if(mid > 0 && v > states[mid - 1])
        {if(states[mid - 1] + states[mid] > 2*v){return(mid - 1);}else{return(mid);}}
      j = mid;
    }
    else
    {
      if (mid < (p - 1) && v < states[mid + 1])
        {if(states[mid] + states[mid + 1] > 2*v){return(mid);}else{return(mid + 1);}}
      i = mid + 1;
    }
  }
  return(mid);
}